

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O2

int SUNLogger_SetDebugFilename(SUNLogger logger,char *debug_filename)

{
  int iVar1;
  
  if (logger == (SUNLogger)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if ((debug_filename != (char *)0x0) && (*debug_filename != '\0')) {
      iVar1 = 0;
      fprintf(_stderr,
              "[LOGGER WARNING] SUNDIALS_LOGGING_LEVEL=%d (build time option) is set too low for DEBUG output, but a DEBUG file was provided. Set the logging level to >= %d and recompile if DEBUG output level is desired.\n"
              ,4,0);
    }
  }
  return iVar1;
}

Assistant:

int SUNLogger_SetDebugFilename(SUNLogger logger, const char* debug_filename)
{
  if (logger == NULL)
  {
    return -1;
  }

  if (!sunLoggerIsOutputRank(logger, NULL))
  {
    return 0;
  }

  if (debug_filename && strcmp(debug_filename, ""))
  {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
    FILE* fp = NULL;
    if (!SUNHashMap_GetValue(logger->filenames, debug_filename, (void*)&fp))
    {
      logger->debug_fp = fp;
    }
    else
    {
      logger->debug_fp = sunOpenLogFile(debug_filename, "w+");
      if (logger->debug_fp)
      {
        SUNHashMap_Insert(logger->filenames, debug_filename,
                          (void*)logger->debug_fp);
      }
      else
      {
        return -1;
      }
    }
#else
    fprintf(stderr,
            "[LOGGER WARNING] "
            "SUNDIALS_LOGGING_LEVEL=%d (build time option) "
            "is set too low for DEBUG output, but a DEBUG file was provided. "
            "Set the logging level to >= %d and recompile if DEBUG output level "
            "is desired.\n", SUN_LOGLEVEL_DEBUG, SUNDIALS_LOGGING_LEVEL);
#endif
  }

  return 0;
}